

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printOriginalExpression
          (ConsoleAssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  AssertionResult *in_RDI;
  long in_FS_OFFSET;
  Colour colourGuard;
  Code in_stack_ffffffffffffff9c;
  Colour *in_stack_ffffffffffffffa0;
  AssertionResult *this_00;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = AssertionResult::hasExpression((AssertionResult *)0x262b9a);
  if (bVar2) {
    Colour::Colour(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    std::operator<<((ostream *)(in_RDI->m_info).macroName.m_start,"  ");
    poVar1 = (ostream *)(in_RDI->m_info).macroName.m_start;
    AssertionResult::getExpressionInMacro_abi_cxx11_(this_00);
    std::operator<<(poVar1,local_28);
    std::__cxx11::string::~string(local_28);
    std::operator<<((ostream *)(in_RDI->m_info).macroName.m_start,'\n');
    Colour::~Colour((Colour *)0x262c1e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            Colour colourGuard(Colour::OriginalExpression);
            stream << "  ";
            stream << result.getExpressionInMacro();
            stream << '\n';
        }
    }